

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O2

Error __thiscall
asmjit::RACFGBuilderT<asmjit::x86::RACFGBuilder>::run
          (RACFGBuilderT<asmjit::x86::RACFGBuilder> *this)

{
  uint32_t *puVar1;
  uint uVar2;
  FuncNode *pFVar3;
  RABlock *pRVar4;
  BaseNode *pBVar5;
  long lVar6;
  void *pvVar7;
  RATiedReg *pRVar8;
  uint8_t uVar9;
  Error EVar10;
  RAWorkReg *pRVar11;
  RABlock *pRVar12;
  RABlock *pRVar13;
  byte bVar14;
  uint uVar15;
  uint32_t uVar16;
  ulong uVar17;
  ulong uVar18;
  InvokeNode *initialNode;
  long lVar19;
  InvokeNode *invokeNode;
  RATiedReg *tiedReg;
  RATiedReg *pRVar20;
  RABlock **ppRVar21;
  uint64_t uVar22;
  uint32_t controlType;
  RABlock **local_ca8;
  LabelNode *labelNode;
  ZoneVector<asmjit::RABlock_*> blocksWithUnknownJumps;
  RAInstBuilder ib;
  
  log<>(this,"[RAPass::BuildCFG]\n");
  EVar10 = prepare(this);
  if (EVar10 == 0) {
    logNode(this,(BaseNode *)this->_funcNode,2,(char *)0x0);
    logBlock(this,this->_curBlock,2);
    pFVar3 = this->_funcNode;
    invokeNode = (InvokeNode *)
                 ((anon_union_16_2_06f92970_for_BaseNode_0 *)&pFVar3->super_LabelNode)->_links[1];
    if (invokeNode != (InvokeNode *)0x0) {
      ppRVar21 = &this->_curBlock;
      pRVar4 = this->_curBlock;
      pRVar4->_first = (BaseNode *)pFVar3;
      pRVar4->_last = (BaseNode *)pFVar3;
      RAInstBuilder::RAInstBuilder(&ib);
      blocksWithUnknownJumps.super_ZoneVectorBase._data = (void *)0x0;
      blocksWithUnknownJumps.super_ZoneVectorBase._size = 0;
      blocksWithUnknownJumps.super_ZoneVectorBase._capacity = 0;
      local_ca8 = ppRVar21;
LAB_00132ba5:
      do {
        uVar16 = (invokeNode->super_InstNode).super_BaseNode._position;
        if (1 < uVar16 + 1) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/x86/../x86/../core/rabuilders_p.h"
                     ,0x6f,"node->position() == 0 || node->position() == kNodePositionDidOnBefore");
        }
        initialNode = (InvokeNode *)(invokeNode->super_InstNode).super_BaseNode.field_0._links[1];
        if (((invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeFlags & 0x20) == 0) {
          if ((invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType == '\x03') {
            pRVar12 = *ppRVar21;
            pRVar13 = (RABlock *)(invokeNode->super_InstNode).super_BaseNode._passData;
            if (pRVar12 == (RABlock *)0x0) {
              *ppRVar21 = pRVar13;
              if (pRVar13 == (RABlock *)0x0) {
                pRVar13 = BaseRAPass::newBlock(this->_pass,(BaseNode *)invokeNode);
                this->_curBlock = pRVar13;
                if (pRVar13 == (RABlock *)0x0) {
                  return 1;
                }
                (invokeNode->super_InstNode).super_BaseNode._passData = pRVar13;
                uVar15 = pRVar13->_flags;
              }
              else {
                uVar15 = pRVar13->_flags;
                if ((uVar15 & 1) != 0) goto LAB_0013320f;
              }
              pRVar13->_flags = uVar15 | 4;
              this->_hasCode = false;
              (this->_blockRegStats)._packed = 0;
              EVar10 = BaseRAPass::addBlock(this->_pass,pRVar13);
              if (EVar10 != 0) {
                return EVar10;
              }
              pRVar12 = *ppRVar21;
            }
            else if (pRVar13 == (RABlock *)0x0) {
              if ((pRVar12 == pRVar4 | this->_hasCode) == 1) {
                if ((InvokeNode *)pRVar12->_last == invokeNode) {
                  DebugUtils::assertionFailed
                            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/x86/../x86/../core/rabuilders_p.h"
                             ,0x183,"_curBlock->last() != node");
                }
                pRVar12->_last = (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
                pRVar12->_flags = pRVar12->_flags | 0x201;
                (pRVar12->_regsStats)._packed =
                     (pRVar12->_regsStats)._packed | (this->_blockRegStats)._packed;
                pRVar12 = BaseRAPass::newBlock(this->_pass,(BaseNode *)invokeNode);
                if (pRVar12 == (RABlock *)0x0) {
                  return 1;
                }
                *(byte *)&pRVar12->_flags = (byte)pRVar12->_flags | 4;
                EVar10 = RABlock::appendSuccessor(*ppRVar21,pRVar12);
                if (EVar10 != 0) {
                  return EVar10;
                }
                EVar10 = BaseRAPass::addBlock(this->_pass,pRVar12);
                if (EVar10 != 0) {
                  return EVar10;
                }
                this->_curBlock = pRVar12;
                this->_hasCode = false;
                (this->_blockRegStats)._packed = 0;
              }
              (invokeNode->super_InstNode).super_BaseNode._passData = pRVar12;
            }
            else {
              *(byte *)&pRVar13->_flags = (byte)pRVar13->_flags | 4;
              if (pRVar12 == pRVar13) {
                if (this->_hasCode != false) break;
              }
              else {
                if ((InvokeNode *)pRVar12->_last == invokeNode) {
                  DebugUtils::assertionFailed
                            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/x86/../x86/../core/rabuilders_p.h"
                             ,0x170,"_curBlock->last() != node");
                }
                pRVar12->_last = (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
                pRVar12->_flags = pRVar12->_flags | 0x201;
                (pRVar12->_regsStats)._packed =
                     (pRVar12->_regsStats)._packed | (this->_blockRegStats)._packed;
                EVar10 = RABlock::appendSuccessor(pRVar12,pRVar13);
                if (EVar10 != 0) {
                  return EVar10;
                }
                EVar10 = BaseRAPass::addBlock(this->_pass,pRVar13);
                if (EVar10 != 0) {
                  return EVar10;
                }
                this->_curBlock = pRVar13;
                this->_hasCode = false;
                (this->_blockRegStats)._packed = 0;
                pRVar12 = pRVar13;
              }
            }
            if ((pRVar12 != (RABlock *)0x0) && (pRVar12 != this->_lastLoggedBlock)) {
              logBlock(this,pRVar12,2);
            }
            logNode(this,(BaseNode *)invokeNode,2,(char *)0x0);
            if ((invokeNode->super_InstNode)._baseInst._id == this->_exitLabelId) {
              pRVar12 = this->_curBlock;
              pRVar12->_last = (BaseNode *)invokeNode;
              *(byte *)&pRVar12->_flags = (byte)pRVar12->_flags | 1;
              (pRVar12->_regsStats)._packed =
                   (pRVar12->_regsStats)._packed | (this->_blockRegStats)._packed;
              EVar10 = BaseRAPass::addExitBlock(this->_pass,pRVar12);
LAB_00132f1a:
              if (EVar10 != 0) {
                return EVar10;
              }
LAB_00133129:
              *ppRVar21 = (RABlock *)0x0;
            }
          }
          else {
            logNode(this,(BaseNode *)invokeNode,4,(char *)0x0);
            uVar9 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
            if (uVar9 == '\n') {
              if (invokeNode == (InvokeNode *)this->_funcNode->_end) {
                if (*ppRVar21 == (RABlock *)0x0) {
LAB_0013320f:
                  pvVar7 = blocksWithUnknownJumps.super_ZoneVectorBase._data;
                  if (this->_pass->_createdBlockCount ==
                      (this->_pass->_blocks).super_ZoneVectorBase._size) {
                    uVar17 = blocksWithUnknownJumps.super_ZoneVectorBase._8_8_ & 0xffffffff;
                    for (lVar19 = 0; uVar17 << 3 != lVar19; lVar19 = lVar19 + 8) {
                      handleBlockWithUnknownJump(this,*(RABlock **)((long)pvVar7 + lVar19));
                    }
                    EVar10 = BaseRAPass::initSharedAssignments
                                       (this->_pass,&this->_sharedAssignmentsMap);
                    return EVar10;
                  }
                  return 3;
                }
                break;
              }
            }
            else if ((uVar9 == '\x10') && (invokeNode != (InvokeNode *)this->_funcNode)) break;
          }
        }
        else {
          if (*ppRVar21 == (RABlock *)0x0) {
            removeNode(this,(BaseNode *)invokeNode);
            invokeNode = initialNode;
            goto LAB_00132ba5;
          }
          this->_hasCode = true;
          uVar9 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if ((byte)(uVar9 - 0x11) < 2) {
            if (uVar16 == 0xffffffff) {
              (invokeNode->super_InstNode).super_BaseNode._position = 0;
            }
            else {
              pBVar5 = (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
              if (uVar9 == '\x12') {
                EVar10 = x86::RACFGBuilder::onBeforeInvoke((RACFGBuilder *)this,invokeNode);
              }
              else {
                EVar10 = x86::RACFGBuilder::onBeforeRet
                                   ((RACFGBuilder *)this,(FuncRetNode *)invokeNode);
              }
              if (EVar10 != 0) {
                return EVar10;
              }
              if (pBVar5 != (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev) {
                if ((InvokeNode *)(*local_ca8)->_first == invokeNode) {
                  (*local_ca8)->_first = (pBVar5->field_0).field_0._next;
                }
                (invokeNode->super_InstNode).super_BaseNode._position = 0xffffffff;
                invokeNode = (InvokeNode *)(pBVar5->field_0)._links[1];
                if (((invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeFlags & 0x20) ==
                    0) {
                  DebugUtils::assertionFailed
                            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/x86/../x86/../core/rabuilders_p.h"
                             ,0x9b,"node->isInst()");
                }
              }
              initialNode = (InvokeNode *)
                            (invokeNode->super_InstNode).super_BaseNode.field_0._links[1];
            }
          }
          logNode(this,(BaseNode *)invokeNode,4,(char *)0x0);
          controlType = 0;
          RAInstBuilder::reset(&ib);
          EVar10 = x86::RACFGBuilder::onInst
                             ((RACFGBuilder *)this,&invokeNode->super_InstNode,&controlType,&ib);
          if (EVar10 != 0) {
            return EVar10;
          }
          uVar9 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if (uVar9 == '\x12') {
            EVar10 = x86::RACFGBuilder::onInvoke((RACFGBuilder *)this,invokeNode,&ib);
            if (EVar10 != 0) {
              return EVar10;
            }
            uVar9 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          }
          pRVar8 = ib._cur;
          if (uVar9 == '\x11') {
            EVar10 = x86::RACFGBuilder::onRet((RACFGBuilder *)this,(FuncRetNode *)invokeNode,&ib);
            if (EVar10 != 0) {
              return EVar10;
            }
            controlType = 4;
          }
          else if (controlType == 1) {
            uVar17 = 0;
            for (pRVar20 = ib._tiedRegs; pRVar20 != pRVar8; pRVar20 = pRVar20 + 1) {
              pRVar11 = BaseRAPass::workRegById(this->_pass,pRVar20->_workId);
              uVar18 = uVar17;
              if (((pRVar11->_info)._signature & 0xf00) == 0) {
                bVar14 = (pRVar20->field_5).field_0._useId;
                if (bVar14 == 0xff) {
                  uVar18 = (ulong)((int)uVar17 + 1);
                  bVar14 = this->_pass->_scratchRegIndexes[uVar17];
                  (pRVar20->field_5).field_0._useId = bVar14;
                }
                (*local_ca8)->_exitScratchGpRegs =
                     (*local_ca8)->_exitScratchGpRegs | 1 << (bVar14 & 0x1f);
              }
              uVar17 = uVar18;
            }
          }
          EVar10 = BaseRAPass::assignRAInst(this->_pass,(BaseNode *)invokeNode,this->_curBlock,&ib);
          ppRVar21 = local_ca8;
          uVar16 = controlType;
          if (EVar10 != 0) {
            return EVar10;
          }
          uVar15 = (this->_blockRegStats)._packed | ib._stats._packed;
          (this->_blockRegStats)._packed = uVar15;
          if (controlType != 0) {
            if (controlType < 3) {
              pRVar12 = *local_ca8;
              pRVar12->_last = (BaseNode *)invokeNode;
              uVar2 = pRVar12->_flags;
              pRVar12->_flags = uVar2 | 0x101;
              (pRVar12->_regsStats)._packed = (pRVar12->_regsStats)._packed | uVar15;
              if (((invokeNode->super_InstNode)._baseInst._options & 2) == 0) {
                bVar14 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._reserved0;
                if (bVar14 == 0) break;
                uVar15 = bVar14 - 1;
                if (((invokeNode->super_InstNode)._opArray[uVar15]._signature & 7) == 4) {
                  EVar10 = BaseBuilder::labelNodeOf
                                     (&this->_cc->super_BaseBuilder,&labelNode,
                                      (Label *)((invokeNode->super_InstNode)._opArray + uVar15));
                  if (EVar10 != 0) {
                    return EVar10;
                  }
                  pRVar12 = BaseRAPass::newBlockOrExistingAt(this->_pass,labelNode,(BaseNode **)0x0)
                  ;
                  if (pRVar12 == (RABlock *)0x0) {
                    return 1;
                  }
                  *(byte *)&pRVar12->_flags = (byte)pRVar12->_flags | 4;
                  EVar10 = RABlock::appendSuccessor(*ppRVar21,pRVar12);
                  uVar16 = controlType;
                }
                else {
                  pRVar12->_flags = uVar2 | 0x501;
                  if (((invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType == '\x0f')
                     && (lVar19 = *(long *)&(invokeNode->_funcDetail)._callConv, lVar19 != 0)) {
                    uVar22 = this->_pass->_lastTimestamp + 1;
                    this->_pass->_lastTimestamp = uVar22;
                    lVar6 = *(long *)(lVar19 + 0x10);
                    uVar15 = *(uint *)(lVar19 + 0x18);
                    for (lVar19 = 0; (ulong)uVar15 << 2 != lVar19; lVar19 = lVar19 + 4) {
                      EVar10 = BaseBuilder::labelNodeOf
                                         (&this->_cc->super_BaseBuilder,&labelNode,
                                          *(uint32_t *)(lVar6 + lVar19));
                      if (EVar10 != 0) {
                        return EVar10;
                      }
                      pRVar12 = BaseRAPass::newBlockOrExistingAt
                                          (this->_pass,labelNode,(BaseNode **)0x0);
                      if (pRVar12 == (RABlock *)0x0) {
                        return 1;
                      }
                      if (pRVar12->_timestamp != uVar22) {
                        pRVar12->_timestamp = uVar22;
                        *(byte *)&pRVar12->_flags = (byte)pRVar12->_flags | 4;
                        EVar10 = RABlock::appendSuccessor(*ppRVar21,pRVar12);
                        if (EVar10 != 0) {
                          return EVar10;
                        }
                      }
                    }
                    EVar10 = shareAssignmentAcrossSuccessors(this,this->_curBlock);
                  }
                  else {
                    EVar10 = ZoneVector<asmjit::RABlock_*>::append
                                       (&blocksWithUnknownJumps,&this->_pass->_allocator,local_ca8);
                  }
                }
                if (EVar10 != 0) {
                  return EVar10;
                }
              }
              if (uVar16 == 1) goto LAB_00133129;
              if (initialNode == (InvokeNode *)0x0) break;
              if ((((anon_union_4_4_9308554c_for_BaseNode_2 *)
                   ((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode + 1))->
                  _any)._nodeType == '\x03') {
                pRVar12 = *(RABlock **)
                           &((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode
                            )[2].field_0;
                if (pRVar12 == (RABlock *)0x0) {
                  pRVar12 = BaseRAPass::newBlock(this->_pass,(BaseNode *)initialNode);
                  if (pRVar12 == (RABlock *)0x0) {
                    return 1;
                  }
                  *(RABlock **)
                   &((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode)[2].
                    field_0 = pRVar12;
                }
              }
              else {
                pRVar12 = BaseRAPass::newBlock(this->_pass,(BaseNode *)initialNode);
                if (pRVar12 == (RABlock *)0x0) {
                  return 1;
                }
              }
              pRVar13 = *ppRVar21;
              puVar1 = &pRVar13->_flags;
              *puVar1 = *puVar1 | 0x200;
              EVar10 = RABlock::prependSuccessor(pRVar13,pRVar12);
              if (EVar10 != 0) {
                return EVar10;
              }
              this->_curBlock = pRVar12;
              this->_hasCode = false;
              (this->_blockRegStats)._packed = 0;
              if ((pRVar12->_flags & 1) != 0) goto LAB_0013320f;
              EVar10 = BaseRAPass::addBlock(this->_pass,pRVar12);
              if (EVar10 != 0) {
                return EVar10;
              }
              logBlock(this,this->_curBlock,2);
              invokeNode = initialNode;
              goto LAB_00132ba5;
            }
            if (controlType == 4) {
              pRVar12 = this->_curBlock;
              pRVar12->_last = (BaseNode *)invokeNode;
              *(byte *)&pRVar12->_flags = (byte)pRVar12->_flags | 1;
              (pRVar12->_regsStats)._packed = (pRVar12->_regsStats)._packed | uVar15;
              EVar10 = RABlock::appendSuccessor(pRVar12,this->_retBlock);
              goto LAB_00132f1a;
            }
          }
        }
        invokeNode = initialNode;
      } while (initialNode != (InvokeNode *)0x0);
    }
    EVar10 = 3;
  }
  return EVar10;
}

Assistant:

Error run() noexcept {
    log("[RAPass::BuildCFG]\n");
    ASMJIT_PROPAGATE(prepare());

    logNode(_funcNode, kRootIndentation);
    logBlock(_curBlock, kRootIndentation);

    RABlock* entryBlock = _curBlock;
    BaseNode* node = _funcNode->next();
    if (ASMJIT_UNLIKELY(!node))
      return DebugUtils::errored(kErrorInvalidState);

    _curBlock->setFirst(_funcNode);
    _curBlock->setLast(_funcNode);

    RAInstBuilder ib;
    ZoneVector<RABlock*> blocksWithUnknownJumps;

    for (;;) {
      BaseNode* next = node->next();
      ASMJIT_ASSERT(node->position() == 0 || node->position() == kNodePositionDidOnBefore);

      if (node->isInst()) {
        // Instruction | Jump | Invoke | Return
        // ------------------------------------

        // Handle `InstNode`, `InvokeNode`, and `FuncRetNode`. All of them
        // share the same interface that provides operands that have read/write
        // semantics.
        if (ASMJIT_UNLIKELY(!_curBlock)) {
          // Unreachable code has to be removed, we cannot allocate registers
          // in such code as we cannot do proper liveness analysis in such case.
          removeNode(node);
          node = next;
          continue;
        }

        _hasCode = true;

        if (node->isInvoke() || node->isFuncRet()) {
          if (node->position() != kNodePositionDidOnBefore) {
            // Call and Reg are complicated as they may insert some surrounding
            // code around them. The simplest approach is to get the previous
            // node, call the `onBefore()` handlers and then check whether
            // anything changed and restart if so. By restart we mean that the
            // current `node` would go back to the first possible inserted node
            // by `onBeforeInvoke()` or `onBeforeRet()`.
            BaseNode* prev = node->prev();

            if (node->type() == BaseNode::kNodeInvoke)
              ASMJIT_PROPAGATE(static_cast<This*>(this)->onBeforeInvoke(node->as<InvokeNode>()));
            else
              ASMJIT_PROPAGATE(static_cast<This*>(this)->onBeforeRet(node->as<FuncRetNode>()));

            if (prev != node->prev()) {
              // If this was the first node in the block and something was
              // inserted before it then we have to update the first block.
              if (_curBlock->first() == node)
                _curBlock->setFirst(prev->next());

              node->setPosition(kNodePositionDidOnBefore);
              node = prev->next();

              // `onBeforeInvoke()` and `onBeforeRet()` can only insert instructions.
              ASMJIT_ASSERT(node->isInst());
            }

            // Necessary if something was inserted after `node`, but nothing before.
            next = node->next();
          }
          else {
            // Change the position back to its original value.
            node->setPosition(0);
          }
        }

        InstNode* inst = node->as<InstNode>();
        logNode(inst, kCodeIndentation);

        uint32_t controlType = BaseInst::kControlNone;
        ib.reset();
        ASMJIT_PROPAGATE(static_cast<This*>(this)->onInst(inst, controlType, ib));

        if (node->isInvoke()) {
          ASMJIT_PROPAGATE(static_cast<This*>(this)->onInvoke(inst->as<InvokeNode>(), ib));
        }

        if (node->isFuncRet()) {
          ASMJIT_PROPAGATE(static_cast<This*>(this)->onRet(inst->as<FuncRetNode>(), ib));
          controlType = BaseInst::kControlReturn;
        }

        if (controlType == BaseInst::kControlJump) {
          uint32_t fixedRegCount = 0;
          for (RATiedReg& tiedReg : ib) {
            RAWorkReg* workReg = _pass->workRegById(tiedReg.workId());
            if (workReg->group() == BaseReg::kGroupGp) {
              uint32_t useId = tiedReg.useId();
              if (useId == BaseReg::kIdBad) {
                useId = _pass->_scratchRegIndexes[fixedRegCount++];
                tiedReg.setUseId(useId);
              }
              _curBlock->addExitScratchGpRegs(Support::bitMask<uint32_t>(useId));
            }
          }
        }

        ASMJIT_PROPAGATE(_pass->assignRAInst(inst, _curBlock, ib));
        _blockRegStats.combineWith(ib._stats);

        if (controlType != BaseInst::kControlNone) {
          // Support for conditional and unconditional jumps.
          if (controlType == BaseInst::kControlJump || controlType == BaseInst::kControlBranch) {
            _curBlock->setLast(node);
            _curBlock->addFlags(RABlock::kFlagHasTerminator);
            _curBlock->makeConstructed(_blockRegStats);

            if (!(inst->instOptions() & BaseInst::kOptionUnfollow)) {
              // Jmp/Jcc/Call/Loop/etc...
              uint32_t opCount = inst->opCount();
              const Operand* opArray = inst->operands();

              // Cannot jump anywhere without operands.
              if (ASMJIT_UNLIKELY(!opCount))
                return DebugUtils::errored(kErrorInvalidState);

              if (opArray[opCount - 1].isLabel()) {
                // Labels are easy for constructing the control flow.
                LabelNode* labelNode;
                ASMJIT_PROPAGATE(cc()->labelNodeOf(&labelNode, opArray[opCount - 1].as<Label>()));

                RABlock* targetBlock = _pass->newBlockOrExistingAt(labelNode);
                if (ASMJIT_UNLIKELY(!targetBlock))
                  return DebugUtils::errored(kErrorOutOfMemory);

                targetBlock->makeTargetable();
                ASMJIT_PROPAGATE(_curBlock->appendSuccessor(targetBlock));
              }
              else {
                // Not a label - could be jump with reg/mem operand, which
                // means that it can go anywhere. Such jumps must either be
                // annotated so the CFG can be properly constructed, otherwise
                // we assume the worst case - can jump to any basic block.
                JumpAnnotation* jumpAnnotation = nullptr;
                _curBlock->addFlags(RABlock::kFlagHasJumpTable);

                if (inst->type() == BaseNode::kNodeJump)
                  jumpAnnotation = inst->as<JumpNode>()->annotation();

                if (jumpAnnotation) {
                  uint64_t timestamp = _pass->nextTimestamp();
                  for (uint32_t id : jumpAnnotation->labelIds()) {
                    LabelNode* labelNode;
                    ASMJIT_PROPAGATE(cc()->labelNodeOf(&labelNode, id));

                    RABlock* targetBlock = _pass->newBlockOrExistingAt(labelNode);
                    if (ASMJIT_UNLIKELY(!targetBlock))
                      return DebugUtils::errored(kErrorOutOfMemory);

                    // Prevents adding basic-block successors multiple times.
                    if (!targetBlock->hasTimestamp(timestamp)) {
                      targetBlock->setTimestamp(timestamp);
                      targetBlock->makeTargetable();
                      ASMJIT_PROPAGATE(_curBlock->appendSuccessor(targetBlock));
                    }
                  }
                  ASMJIT_PROPAGATE(shareAssignmentAcrossSuccessors(_curBlock));
                }
                else {
                  ASMJIT_PROPAGATE(blocksWithUnknownJumps.append(_pass->allocator(), _curBlock));
                }
              }
            }

            if (controlType == BaseInst::kControlJump) {
              // Unconditional jump makes the code after the jump unreachable,
              // which will be removed instantly during the CFG construction;
              // as we cannot allocate registers for instructions that are not
              // part of any block. Of course we can leave these instructions
              // as they are, however, that would only postpone the problem as
              // assemblers can't encode instructions that use virtual registers.
              _curBlock = nullptr;
            }
            else {
              node = next;
              if (ASMJIT_UNLIKELY(!node))
                return DebugUtils::errored(kErrorInvalidState);

              RABlock* consecutiveBlock;
              if (node->type() == BaseNode::kNodeLabel) {
                if (node->hasPassData()) {
                  consecutiveBlock = node->passData<RABlock>();
                }
                else {
                  consecutiveBlock = _pass->newBlock(node);
                  if (ASMJIT_UNLIKELY(!consecutiveBlock))
                    return DebugUtils::errored(kErrorOutOfMemory);
                  node->setPassData<RABlock>(consecutiveBlock);
                }
              }
              else {
                consecutiveBlock = _pass->newBlock(node);
                if (ASMJIT_UNLIKELY(!consecutiveBlock))
                  return DebugUtils::errored(kErrorOutOfMemory);
              }

              _curBlock->addFlags(RABlock::kFlagHasConsecutive);
              ASMJIT_PROPAGATE(_curBlock->prependSuccessor(consecutiveBlock));

              _curBlock = consecutiveBlock;
              _hasCode = false;
              _blockRegStats.reset();

              if (_curBlock->isConstructed())
                break;
              ASMJIT_PROPAGATE(_pass->addBlock(consecutiveBlock));

              logBlock(_curBlock, kRootIndentation);
              continue;
            }
          }

          if (controlType == BaseInst::kControlReturn) {
            _curBlock->setLast(node);
            _curBlock->makeConstructed(_blockRegStats);
            ASMJIT_PROPAGATE(_curBlock->appendSuccessor(_retBlock));

            _curBlock = nullptr;
          }
        }
      }
      else if (node->type() == BaseNode::kNodeLabel) {
        // Label - Basic-Block Management
        // ------------------------------

        if (!_curBlock) {
          // If the current code is unreachable the label makes it reachable
          // again. We may remove the whole block in the future if it's not
          // referenced though.
          _curBlock = node->passData<RABlock>();

          if (_curBlock) {
            // If the label has a block assigned we can either continue with
            // it or skip it if the block has been constructed already.
            if (_curBlock->isConstructed())
              break;
          }
          else {
            // No block assigned - create a new one and assign it.
            _curBlock = _pass->newBlock(node);
            if (ASMJIT_UNLIKELY(!_curBlock))
              return DebugUtils::errored(kErrorOutOfMemory);
            node->setPassData<RABlock>(_curBlock);
          }

          _curBlock->makeTargetable();
          _hasCode = false;
          _blockRegStats.reset();
          ASMJIT_PROPAGATE(_pass->addBlock(_curBlock));
        }
        else {
          if (node->hasPassData()) {
            RABlock* consecutive = node->passData<RABlock>();
            consecutive->makeTargetable();

            if (_curBlock == consecutive) {
              // The label currently processed is part of the current block. This
              // is only possible for multiple labels that are right next to each
              // other or labels that are separated by non-code nodes like directives
              // and comments.
              if (ASMJIT_UNLIKELY(_hasCode))
                return DebugUtils::errored(kErrorInvalidState);
            }
            else {
              // Label makes the current block constructed. There is a chance that the
              // Label is not used, but we don't know that at this point. In the worst
              // case there would be two blocks next to each other, it's just fine.
              ASMJIT_ASSERT(_curBlock->last() != node);
              _curBlock->setLast(node->prev());
              _curBlock->addFlags(RABlock::kFlagHasConsecutive);
              _curBlock->makeConstructed(_blockRegStats);

              ASMJIT_PROPAGATE(_curBlock->appendSuccessor(consecutive));
              ASMJIT_PROPAGATE(_pass->addBlock(consecutive));

              _curBlock = consecutive;
              _hasCode = false;
              _blockRegStats.reset();
            }
          }
          else {
            // First time we see this label.
            if (_hasCode || _curBlock == entryBlock) {
              // Cannot continue the current block if it already contains some
              // code or it's a block entry. We need to create a new block and
              // make it a successor.
              ASMJIT_ASSERT(_curBlock->last() != node);
              _curBlock->setLast(node->prev());
              _curBlock->addFlags(RABlock::kFlagHasConsecutive);
              _curBlock->makeConstructed(_blockRegStats);

              RABlock* consecutive = _pass->newBlock(node);
              if (ASMJIT_UNLIKELY(!consecutive))
                return DebugUtils::errored(kErrorOutOfMemory);
              consecutive->makeTargetable();

              ASMJIT_PROPAGATE(_curBlock->appendSuccessor(consecutive));
              ASMJIT_PROPAGATE(_pass->addBlock(consecutive));

              _curBlock = consecutive;
              _hasCode = false;
              _blockRegStats.reset();
            }

            node->setPassData<RABlock>(_curBlock);
          }
        }

        if (_curBlock && _curBlock != _lastLoggedBlock)
          logBlock(_curBlock, kRootIndentation);
        logNode(node, kRootIndentation);

        // Unlikely: Assume that the exit label is reached only once per function.
        if (ASMJIT_UNLIKELY(node->as<LabelNode>()->labelId() == _exitLabelId)) {
          _curBlock->setLast(node);
          _curBlock->makeConstructed(_blockRegStats);
          ASMJIT_PROPAGATE(_pass->addExitBlock(_curBlock));

          _curBlock = nullptr;
        }
      }
      else {
        // Other Nodes | Function Exit
        // ---------------------------

        logNode(node, kCodeIndentation);

        if (node->type() == BaseNode::kNodeSentinel) {
          if (node == _funcNode->endNode()) {
            // Make sure we didn't flow here if this is the end of the function sentinel.
            if (ASMJIT_UNLIKELY(_curBlock))
              return DebugUtils::errored(kErrorInvalidState);
            break;
          }
        }
        else if (node->type() == BaseNode::kNodeFunc) {
          // RAPass can only compile a single function at a time. If we
          // encountered a function it must be the current one, bail if not.
          if (ASMJIT_UNLIKELY(node != _funcNode))
            return DebugUtils::errored(kErrorInvalidState);
          // PASS if this is the first node.
        }
        else {
          // PASS if this is a non-interesting or unknown node.
        }
      }

      // Advance to the next node.
      node = next;

      // NOTE: We cannot encounter a NULL node, because every function must be
      // terminated by a sentinel (`stop`) node. If we encountered a NULL node it
      // means that something went wrong and this node list is corrupted; bail in
      // such case.
      if (ASMJIT_UNLIKELY(!node))
        return DebugUtils::errored(kErrorInvalidState);
    }

    if (_pass->hasDanglingBlocks())
      return DebugUtils::errored(kErrorInvalidState);

    for (RABlock* block : blocksWithUnknownJumps)
      handleBlockWithUnknownJump(block);

    return _pass->initSharedAssignments(_sharedAssignmentsMap);
  }